

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDate __thiscall QDate::addMonths(QDate *this,int nmonths)

{
  qint64 jd;
  QDate QVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  qint64 qVar5;
  YearMonthDay YVar6;
  
  jd = this->jd;
  qVar5 = -0x8000000000000000;
  if ((0xfffffe92c1eb868b < jd - 0xb69f248055U) && (qVar5 = jd, nmonths != 0)) {
    YVar6 = QGregorianCalendar::partsFromJulian(jd);
    qVar5 = -0x8000000000000000;
    if (YVar6._0_8_ >> 0x20 != 0x80000000) {
      uVar3 = CONCAT44(YVar6.month + nmonths,YVar6.year);
      while ((int)(uVar3 >> 0x20) < 1) {
        uVar2 = (int)uVar3 - 1;
        uVar4 = (uVar3 & 0xffffffff00000000) + 0xc00000000;
        if (uVar2 == 0) {
          uVar4 = uVar3 & 0xffffffff00000000;
        }
        uVar3 = uVar4 | uVar2;
      }
      for (; 0xc < (int)(uVar3 >> 0x20);
          uVar3 = (ulong)((int)uVar3 + 1 + (uint)((int)uVar3 == -1)) +
                  ((uVar3 & 0xffffffff00000000) - 0xc00000000)) {
      }
      YVar6.day = YVar6.day;
      YVar6.year = (int)uVar3;
      YVar6.month = (int)(uVar3 >> 0x20);
      QVar1 = fixedDate(YVar6);
      return (QDate)QVar1.jd;
    }
  }
  return (QDate)qVar5;
}

Assistant:

QDate QDate::addMonths(int nmonths) const
{
    if (isNull())
        return QDate();

    if (nmonths == 0)
        return *this;

    auto parts = QGregorianCalendar::partsFromJulian(jd);

    if (!parts.isValid())
        return QDate();
    Q_ASSERT(parts.year);

    parts.month += nmonths;
    while (parts.month <= 0) {
        if (--parts.year) // skip over year 0
            parts.month += 12;
    }
    while (parts.month > 12) {
        parts.month -= 12;
        if (!++parts.year) // skip over year 0
            ++parts.year;
    }

    return fixedDate(parts);
}